

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

int sendMessage(string *cmd,int new_fd,string *currUser,
               vector<cUser,_std::allocator<cUser>_> *currUsers,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs)

{
  __type _Var1;
  bool bVar2;
  reference paVar3;
  ostream *poVar4;
  pointer paVar5;
  reference pvVar6;
  ssize_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_188;
  anon_class_32_1_d815ae54_for__M_pred local_180;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_160;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_158;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_150;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> it;
  undefined1 local_140 [8];
  cUser user;
  iterator __end2;
  iterator __begin2;
  vector<cUser,_std::allocator<cUser>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [39];
  allocator local_b9;
  string local_b8 [48];
  string local_88 [8];
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  string username;
  size_t spacePos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *msgs_local;
  bool *msgFlags_local;
  vector<cUser,_std::allocator<cUser>_> *currUsers_local;
  string *currUser_local;
  int new_fd_local;
  string *cmd_local;
  
  std::__cxx11::string::find((char *)cmd,0x118219);
  std::__cxx11::string::substr((ulong)local_68,(ulong)cmd);
  std::__cxx11::string::substr((ulong)local_88,(ulong)cmd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"all",&local_b9);
  _Var1 = std::operator==(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if (_Var1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   (char *)currUser);
    std::operator+(local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__range2);
    std::__cxx11::string::operator=(local_88,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&__range2);
    poVar4 = std::operator<<((ostream *)&std::cout,local_88);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __end2 = std::vector<cUser,_std::allocator<cUser>_>::begin(currUsers);
    user._32_8_ = std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>
                                       *)&user.id), bVar2) {
      paVar3 = __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::
               operator*(&__end2);
      anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)local_140,paVar3);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_140,currUser);
      if (bVar2) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](msgs,(long)(int)user._24_4_);
        std::__cxx11::string::operator=((string *)pvVar6,local_88);
        msgFlags[(int)user._24_4_] = true;
      }
      anon_struct_40_2_6a8bb0e8::~cUser((anon_struct_40_2_6a8bb0e8 *)local_140);
      __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::operator++
                (&__end2);
    }
    cmd_local._4_4_ = 1;
  }
  else {
    local_158._M_current =
         (anon_struct_40_2_6a8bb0e8 *)std::vector<cUser,_std::allocator<cUser>_>::begin(currUsers);
    local_160._M_current =
         (anon_struct_40_2_6a8bb0e8 *)std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
    std::__cxx11::string::string((string *)&local_180,(string *)local_68);
    local_150 = std::
                find_if<__gnu_cxx::__normal_iterator<cUser*,std::vector<cUser,std::allocator<cUser>>>,sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          (local_158,local_160,&local_180);
    sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
    ::$_0::~__0((__0 *)&local_180);
    local_188._M_current =
         (anon_struct_40_2_6a8bb0e8 *)std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
    bVar2 = __gnu_cxx::operator!=(&local_150,&local_188);
    if (bVar2) {
      std::operator+(local_208,(char *)currUser);
      std::operator+(local_1e8,local_208);
      std::operator+(local_1c8,(char *)local_1e8);
      std::operator+(local_1a8,local_1c8);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_1a8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)local_208);
      std::operator+(local_248,(char *)currUser);
      std::operator+(local_228,local_248);
      std::__cxx11::string::operator=(local_88,(string *)local_228);
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string((string *)local_248);
      paVar5 = __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::
               operator->(&local_150);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](msgs,(long)paVar5->id);
      std::__cxx11::string::operator=((string *)pvVar6,local_88);
      paVar5 = __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::
               operator->(&local_150);
      msgFlags[paVar5->id] = true;
      cmd_local._4_4_ = 1;
    }
    else {
      sVar7 = send(new_fd,"Invalid UserID to send message",0x20,0);
      if (sVar7 == -1) {
        perror("Another send error bro");
      }
      cmd_local._4_4_ = 0;
    }
  }
  it._M_current._4_4_ = 1;
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_68);
  return cmd_local._4_4_;
}

Assistant:

int sendMessage(string cmd, int new_fd, const string& currUser, vector<cUser>& currUsers,
 bool* msgFlags, vector<string>& msgs){
    //find where the space is int he
    size_t spacePos = cmd.find(" ");
    //pull out the username to send the message to
    string username = cmd.substr(0,spacePos);
    // pull out th message from the command string
    string msg = cmd.substr(spacePos+1);


    //handle the boadcast case
    if(username == string("all")){
        msg = currUser + ": " + msg;

        cout << msg << endl;

        //set all loged in users message flags and add the message to their queue
        for(cUser user : currUsers){
            if(user.username != currUser){
                msgs[user.id] = msg;
                msgFlags[user.id] = true;
            }
        }
        return 1;
    }

    // check if the message is being sent to a logged in user
    auto it = find_if(currUsers.begin(), currUsers.end(),[username](cUser u){
        return (u.username == username);
    });

    //if the user is logged in set the flag and add the message to their queue
    if(it != currUsers.end()){

        cout << currUser + " (to " + username + "): " + msg << endl;

        msg = currUser + ": " + msg;
        msgs[it->id] = msg;
        msgFlags[it->id] = true;

        return 1;
    }

    //send and error if the user is not logged in
    if(send(new_fd, "Invalid UserID to send message", 32, 0) == -1)
        perror("Another send error bro");

    return 0;
}